

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall CoreML::Specification::NeuralNetworkLayer::clear_layer(NeuralNetworkLayer *this)

{
  uint32 uVar1;
  
  uVar1 = this->_oneof_case_[0];
  if ((int)uVar1 < 0x370) {
    if ((int)uVar1 < 0x25d) {
      if ((int)uVar1 < 0xfa) {
        if ((int)uVar1 < 0xbe) {
          if ((int)uVar1 < 0xa0) {
            if ((int)uVar1 < 0x82) {
              if ((uVar1 != 100) && (uVar1 != 0x78)) goto switchD_0046d7d8_caseD_33a;
            }
            else if ((uVar1 != 0x82) && ((uVar1 != 0x8c && (uVar1 != 0x96))))
            goto switchD_0046d7d8_caseD_33a;
          }
          else if ((int)uVar1 < 0xaa) {
            if ((uVar1 != 0xa0) && (uVar1 != 0xa5)) goto switchD_0046d7d8_caseD_33a;
          }
          else if ((uVar1 != 0xaa) && ((uVar1 != 0xaf && (uVar1 != 0xb4))))
          goto switchD_0046d7d8_caseD_33a;
        }
        else if ((int)uVar1 < 0xdc) {
          if ((int)uVar1 < 0xd2) {
            if ((uVar1 != 0xbe) && (uVar1 != 200)) goto switchD_0046d7d8_caseD_33a;
          }
          else if ((uVar1 != 0xd2) && ((uVar1 != 0xd3 && (uVar1 != 0xd4))))
          goto switchD_0046d7d8_caseD_33a;
        }
        else if ((int)uVar1 < 0xe7) {
          if ((uVar1 != 0xdc) && (uVar1 != 0xe6)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0xe7) && ((uVar1 != 0xf0 && (uVar1 != 0xf5))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x14a) {
        if ((int)uVar1 < 0x122) {
          if ((int)uVar1 < 0x105) {
            if ((uVar1 != 0xfa) && (uVar1 != 0x104)) goto switchD_0046d7d8_caseD_33a;
          }
          else if ((uVar1 != 0x105) && ((uVar1 != 0x10e && (uVar1 != 0x118))))
          goto switchD_0046d7d8_caseD_33a;
        }
        else if ((int)uVar1 < 0x12d) {
          if ((uVar1 != 0x122) && (uVar1 != 300)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x12d) && ((uVar1 != 0x136 && (uVar1 != 0x140))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x19a) {
        if ((int)uVar1 < 0x159) {
          if ((uVar1 != 0x14a) && (uVar1 != 0x154)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x159) && ((uVar1 != 0x15e && (uVar1 != 400))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x1ae) {
        if ((uVar1 != 0x19a) && (uVar1 != 0x1a4)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x1ae) && ((uVar1 != 500 && (uVar1 != 600))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x2f8) {
      if ((int)uVar1 < 0x2ad) {
        if ((int)uVar1 < 0x280) {
          if ((int)uVar1 < 0x26c) {
            if ((uVar1 != 0x25d) && (uVar1 != 0x267)) goto switchD_0046d7d8_caseD_33a;
          }
          else if ((uVar1 != 0x26c) && ((uVar1 != 0x271 && (uVar1 != 0x27b))))
          goto switchD_0046d7d8_caseD_33a;
        }
        else if ((int)uVar1 < 0x299) {
          if ((uVar1 != 0x280) && (uVar1 != 0x294)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x299) && ((uVar1 != 0x29e && (uVar1 != 0x2a8))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x2da) {
        if ((int)uVar1 < 0x2c6) {
          if ((uVar1 != 0x2ad) && (uVar1 != 700)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x2c6) && ((uVar1 != 0x2cb && (uVar1 != 0x2d0))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x2e4) {
        if ((uVar1 != 0x2da) && (uVar1 != 0x2df)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x2e4) && ((uVar1 != 0x2ee && (uVar1 != 0x2f3))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x339) {
      if ((int)uVar1 < 0x316) {
        if ((int)uVar1 < 0x307) {
          if ((uVar1 != 0x2f8) && (uVar1 != 0x302)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x307) && (uVar1 != 0x30c)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x32f) {
        if ((uVar1 != 0x316) && (uVar1 != 0x31b)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x32f) && (uVar1 != 0x334)) goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x352) {
      switch(uVar1) {
      case 0x339:
      case 0x33b:
      case 0x33e:
      case 0x340:
        break;
      case 0x33a:
      case 0x33c:
      case 0x33d:
      case 0x33f:
        goto switchD_0046d7d8_caseD_33a;
      default:
        if ((uVar1 != 0x348) && (uVar1 != 0x34d)) goto switchD_0046d7d8_caseD_33a;
      }
    }
    else if ((int)uVar1 < 0x361) {
      if ((uVar1 != 0x352) && (uVar1 != 0x357)) goto switchD_0046d7d8_caseD_33a;
    }
    else if ((uVar1 != 0x361) && ((uVar1 != 0x366 && (uVar1 != 0x36b))))
    goto switchD_0046d7d8_caseD_33a;
  }
  else if ((int)uVar1 < 0x474) {
    if ((int)uVar1 < 0x3e3) {
      if ((int)uVar1 < 0x3ac) {
        if ((int)uVar1 < 0x389) {
          if ((int)uVar1 < 0x37a) {
            if ((uVar1 != 0x370) && (uVar1 != 0x375)) goto switchD_0046d7d8_caseD_33a;
          }
          else if ((uVar1 != 0x37a) && ((uVar1 != 0x37f && (uVar1 != 900))))
          goto switchD_0046d7d8_caseD_33a;
        }
        else if ((int)uVar1 < 0x39d) {
          if ((uVar1 != 0x389) && (uVar1 != 0x398)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x39d) && ((uVar1 != 0x3a2 && (uVar1 != 0x3a7))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x3c0) {
        switch(uVar1) {
        case 0x3b1:
        case 0x3b6:
        case 0x3b8:
        case 0x3ba:
          break;
        case 0x3b2:
        case 0x3b3:
        case 0x3b4:
        case 0x3b5:
        case 0x3b7:
        case 0x3b9:
          goto switchD_0046d7d8_caseD_33a;
        default:
          if (uVar1 != 0x3ac) goto switchD_0046d7d8_caseD_33a;
        }
      }
      else if ((int)uVar1 < 0x3cf) {
        if ((uVar1 != 0x3c0) && (uVar1 != 0x3c5)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x3cf) && ((uVar1 != 0x3d4 && (uVar1 != 0x3d9))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x438) {
      if ((int)uVar1 < 0x401) {
        if ((int)uVar1 < 0x3ed) {
          if ((uVar1 != 0x3e3) && (uVar1 != 1000)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x3ed) && ((uVar1 != 0x3f7 && (uVar1 != 0x3fc))))
        goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x415) {
        if ((uVar1 != 0x401) && (uVar1 != 0x410)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x415) && ((uVar1 != 0x429 && (uVar1 != 0x42e))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x456) {
      if ((int)uVar1 < 0x442) {
        if ((uVar1 != 0x438) && (uVar1 != 0x43d)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x442) && ((uVar1 != 0x44c && (uVar1 != 0x451))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x465) {
      if ((uVar1 != 0x456) && (uVar1 != 0x460)) goto switchD_0046d7d8_caseD_33a;
    }
    else if ((uVar1 != 0x465) && ((uVar1 != 0x46a && (uVar1 != 0x46f))))
    goto switchD_0046d7d8_caseD_33a;
  }
  else if ((int)uVar1 < 0x4fb) {
    if ((int)uVar1 < 0x4b0) {
      if ((int)uVar1 < 0x492) {
        if ((int)uVar1 < 0x47e) {
          if ((uVar1 != 0x474) && (uVar1 != 0x479)) goto switchD_0046d7d8_caseD_33a;
        }
        else if ((uVar1 != 0x47e) && (uVar1 != 0x483)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((int)uVar1 < 0x49c) {
        if ((uVar1 != 0x492) && (uVar1 != 0x497)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x49c) && ((uVar1 != 0x4a6 && (uVar1 != 0x4ab))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x4e2) {
      if ((int)uVar1 < 0x4bf) {
        if ((uVar1 != 0x4b0) && (uVar1 != 0x4ba)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x4bf) && ((uVar1 != 0x4c4 && (uVar1 != 0x4ce))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x4ec) {
      if ((uVar1 != 0x4e2) && (uVar1 != 0x4e7)) goto switchD_0046d7d8_caseD_33a;
    }
    else if ((uVar1 != 0x4ec) && ((uVar1 != 0x4f1 && (uVar1 != 0x4f6))))
    goto switchD_0046d7d8_caseD_33a;
  }
  else if ((int)uVar1 < 0x546) {
    if ((int)uVar1 < 0x521) {
      if ((int)uVar1 < 0x505) {
        if ((uVar1 != 0x4fb) && (uVar1 != 0x500)) goto switchD_0046d7d8_caseD_33a;
      }
      else if ((uVar1 != 0x505) && ((uVar1 != 0x50a && (uVar1 != 0x50f))))
      goto switchD_0046d7d8_caseD_33a;
    }
    else if ((int)uVar1 < 0x528) {
      if ((uVar1 != 0x521) && (uVar1 != 0x523)) goto switchD_0046d7d8_caseD_33a;
    }
    else if ((uVar1 != 0x528) && ((uVar1 != 0x52d && (uVar1 != 0x532))))
    goto switchD_0046d7d8_caseD_33a;
  }
  else {
    if (0x5ae < (int)uVar1) {
      switch(uVar1) {
      case 0x5af:
      case 0x5b4:
      case 0x5b5:
      case 0x5b9:
      case 0x5ba:
      case 0x5be:
      case 0x5bf:
        goto switchD_0046d7d8_caseD_339;
      default:
        goto switchD_0046d7d8_caseD_33a;
      }
    }
    if (((uVar1 != 0x546) && (uVar1 != 0x578)) && (uVar1 != 0x5aa)) goto switchD_0046d7d8_caseD_33a;
  }
switchD_0046d7d8_caseD_339:
  if ((this->layer_).convolution_ != (ConvolutionLayerParams *)0x0) {
    (*(((this->layer_).convolution_)->super_MessageLite)._vptr_MessageLite[1])();
  }
switchD_0046d7d8_caseD_33a:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NeuralNetworkLayer::clear_layer() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NeuralNetworkLayer)
  switch (layer_case()) {
    case kConvolution: {
      delete layer_.convolution_;
      break;
    }
    case kPooling: {
      delete layer_.pooling_;
      break;
    }
    case kActivation: {
      delete layer_.activation_;
      break;
    }
    case kInnerProduct: {
      delete layer_.innerproduct_;
      break;
    }
    case kEmbedding: {
      delete layer_.embedding_;
      break;
    }
    case kBatchnorm: {
      delete layer_.batchnorm_;
      break;
    }
    case kMvn: {
      delete layer_.mvn_;
      break;
    }
    case kL2Normalize: {
      delete layer_.l2normalize_;
      break;
    }
    case kSoftmax: {
      delete layer_.softmax_;
      break;
    }
    case kLrn: {
      delete layer_.lrn_;
      break;
    }
    case kCrop: {
      delete layer_.crop_;
      break;
    }
    case kPadding: {
      delete layer_.padding_;
      break;
    }
    case kUpsample: {
      delete layer_.upsample_;
      break;
    }
    case kResizeBilinear: {
      delete layer_.resizebilinear_;
      break;
    }
    case kCropResize: {
      delete layer_.cropresize_;
      break;
    }
    case kUnary: {
      delete layer_.unary_;
      break;
    }
    case kAdd: {
      delete layer_.add_;
      break;
    }
    case kMultiply: {
      delete layer_.multiply_;
      break;
    }
    case kAverage: {
      delete layer_.average_;
      break;
    }
    case kScale: {
      delete layer_.scale_;
      break;
    }
    case kBias: {
      delete layer_.bias_;
      break;
    }
    case kMax: {
      delete layer_.max_;
      break;
    }
    case kMin: {
      delete layer_.min_;
      break;
    }
    case kDot: {
      delete layer_.dot_;
      break;
    }
    case kReduce: {
      delete layer_.reduce_;
      break;
    }
    case kLoadConstant: {
      delete layer_.loadconstant_;
      break;
    }
    case kReshape: {
      delete layer_.reshape_;
      break;
    }
    case kFlatten: {
      delete layer_.flatten_;
      break;
    }
    case kPermute: {
      delete layer_.permute_;
      break;
    }
    case kConcat: {
      delete layer_.concat_;
      break;
    }
    case kSplit: {
      delete layer_.split_;
      break;
    }
    case kSequenceRepeat: {
      delete layer_.sequencerepeat_;
      break;
    }
    case kReorganizeData: {
      delete layer_.reorganizedata_;
      break;
    }
    case kSlice: {
      delete layer_.slice_;
      break;
    }
    case kSimpleRecurrent: {
      delete layer_.simplerecurrent_;
      break;
    }
    case kGru: {
      delete layer_.gru_;
      break;
    }
    case kUniDirectionalLSTM: {
      delete layer_.unidirectionallstm_;
      break;
    }
    case kBiDirectionalLSTM: {
      delete layer_.bidirectionallstm_;
      break;
    }
    case kCustom: {
      delete layer_.custom_;
      break;
    }
    case kCopy: {
      delete layer_.copy_;
      break;
    }
    case kBranch: {
      delete layer_.branch_;
      break;
    }
    case kLoop: {
      delete layer_.loop_;
      break;
    }
    case kLoopBreak: {
      delete layer_.loopbreak_;
      break;
    }
    case kLoopContinue: {
      delete layer_.loopcontinue_;
      break;
    }
    case kRangeStatic: {
      delete layer_.rangestatic_;
      break;
    }
    case kRangeDynamic: {
      delete layer_.rangedynamic_;
      break;
    }
    case kClip: {
      delete layer_.clip_;
      break;
    }
    case kCeil: {
      delete layer_.ceil_;
      break;
    }
    case kFloor: {
      delete layer_.floor_;
      break;
    }
    case kSign: {
      delete layer_.sign_;
      break;
    }
    case kRound: {
      delete layer_.round_;
      break;
    }
    case kExp2: {
      delete layer_.exp2_;
      break;
    }
    case kSin: {
      delete layer_.sin_;
      break;
    }
    case kCos: {
      delete layer_.cos_;
      break;
    }
    case kTan: {
      delete layer_.tan_;
      break;
    }
    case kAsin: {
      delete layer_.asin_;
      break;
    }
    case kAcos: {
      delete layer_.acos_;
      break;
    }
    case kAtan: {
      delete layer_.atan_;
      break;
    }
    case kSinh: {
      delete layer_.sinh_;
      break;
    }
    case kCosh: {
      delete layer_.cosh_;
      break;
    }
    case kTanh: {
      delete layer_.tanh_;
      break;
    }
    case kAsinh: {
      delete layer_.asinh_;
      break;
    }
    case kAcosh: {
      delete layer_.acosh_;
      break;
    }
    case kAtanh: {
      delete layer_.atanh_;
      break;
    }
    case kErf: {
      delete layer_.erf_;
      break;
    }
    case kGelu: {
      delete layer_.gelu_;
      break;
    }
    case kEqual: {
      delete layer_.equal_;
      break;
    }
    case kNotEqual: {
      delete layer_.notequal_;
      break;
    }
    case kLessThan: {
      delete layer_.lessthan_;
      break;
    }
    case kLessEqual: {
      delete layer_.lessequal_;
      break;
    }
    case kGreaterThan: {
      delete layer_.greaterthan_;
      break;
    }
    case kGreaterEqual: {
      delete layer_.greaterequal_;
      break;
    }
    case kLogicalOr: {
      delete layer_.logicalor_;
      break;
    }
    case kLogicalXor: {
      delete layer_.logicalxor_;
      break;
    }
    case kLogicalNot: {
      delete layer_.logicalnot_;
      break;
    }
    case kLogicalAnd: {
      delete layer_.logicaland_;
      break;
    }
    case kModBroadcastable: {
      delete layer_.modbroadcastable_;
      break;
    }
    case kMinBroadcastable: {
      delete layer_.minbroadcastable_;
      break;
    }
    case kMaxBroadcastable: {
      delete layer_.maxbroadcastable_;
      break;
    }
    case kAddBroadcastable: {
      delete layer_.addbroadcastable_;
      break;
    }
    case kPowBroadcastable: {
      delete layer_.powbroadcastable_;
      break;
    }
    case kDivideBroadcastable: {
      delete layer_.dividebroadcastable_;
      break;
    }
    case kFloorDivBroadcastable: {
      delete layer_.floordivbroadcastable_;
      break;
    }
    case kMultiplyBroadcastable: {
      delete layer_.multiplybroadcastable_;
      break;
    }
    case kSubtractBroadcastable: {
      delete layer_.subtractbroadcastable_;
      break;
    }
    case kTile: {
      delete layer_.tile_;
      break;
    }
    case kStack: {
      delete layer_.stack_;
      break;
    }
    case kGather: {
      delete layer_.gather_;
      break;
    }
    case kScatter: {
      delete layer_.scatter_;
      break;
    }
    case kGatherND: {
      delete layer_.gathernd_;
      break;
    }
    case kScatterND: {
      delete layer_.scatternd_;
      break;
    }
    case kSoftmaxND: {
      delete layer_.softmaxnd_;
      break;
    }
    case kGatherAlongAxis: {
      delete layer_.gatheralongaxis_;
      break;
    }
    case kScatterAlongAxis: {
      delete layer_.scatteralongaxis_;
      break;
    }
    case kReverse: {
      delete layer_.reverse_;
      break;
    }
    case kReverseSeq: {
      delete layer_.reverseseq_;
      break;
    }
    case kSplitND: {
      delete layer_.splitnd_;
      break;
    }
    case kConcatND: {
      delete layer_.concatnd_;
      break;
    }
    case kTranspose: {
      delete layer_.transpose_;
      break;
    }
    case kSliceStatic: {
      delete layer_.slicestatic_;
      break;
    }
    case kSliceDynamic: {
      delete layer_.slicedynamic_;
      break;
    }
    case kSlidingWindows: {
      delete layer_.slidingwindows_;
      break;
    }
    case kTopK: {
      delete layer_.topk_;
      break;
    }
    case kArgMin: {
      delete layer_.argmin_;
      break;
    }
    case kArgMax: {
      delete layer_.argmax_;
      break;
    }
    case kEmbeddingND: {
      delete layer_.embeddingnd_;
      break;
    }
    case kBatchedMatmul: {
      delete layer_.batchedmatmul_;
      break;
    }
    case kGetShape: {
      delete layer_.getshape_;
      break;
    }
    case kLoadConstantND: {
      delete layer_.loadconstantnd_;
      break;
    }
    case kFillLike: {
      delete layer_.filllike_;
      break;
    }
    case kFillStatic: {
      delete layer_.fillstatic_;
      break;
    }
    case kFillDynamic: {
      delete layer_.filldynamic_;
      break;
    }
    case kBroadcastToLike: {
      delete layer_.broadcasttolike_;
      break;
    }
    case kBroadcastToStatic: {
      delete layer_.broadcasttostatic_;
      break;
    }
    case kBroadcastToDynamic: {
      delete layer_.broadcasttodynamic_;
      break;
    }
    case kSqueeze: {
      delete layer_.squeeze_;
      break;
    }
    case kExpandDims: {
      delete layer_.expanddims_;
      break;
    }
    case kFlattenTo2D: {
      delete layer_.flattento2d_;
      break;
    }
    case kReshapeLike: {
      delete layer_.reshapelike_;
      break;
    }
    case kReshapeStatic: {
      delete layer_.reshapestatic_;
      break;
    }
    case kReshapeDynamic: {
      delete layer_.reshapedynamic_;
      break;
    }
    case kRankPreservingReshape: {
      delete layer_.rankpreservingreshape_;
      break;
    }
    case kConstantPad: {
      delete layer_.constantpad_;
      break;
    }
    case kRandomNormalLike: {
      delete layer_.randomnormallike_;
      break;
    }
    case kRandomNormalStatic: {
      delete layer_.randomnormalstatic_;
      break;
    }
    case kRandomNormalDynamic: {
      delete layer_.randomnormaldynamic_;
      break;
    }
    case kRandomUniformLike: {
      delete layer_.randomuniformlike_;
      break;
    }
    case kRandomUniformStatic: {
      delete layer_.randomuniformstatic_;
      break;
    }
    case kRandomUniformDynamic: {
      delete layer_.randomuniformdynamic_;
      break;
    }
    case kRandomBernoulliLike: {
      delete layer_.randombernoullilike_;
      break;
    }
    case kRandomBernoulliStatic: {
      delete layer_.randombernoullistatic_;
      break;
    }
    case kRandomBernoulliDynamic: {
      delete layer_.randombernoullidynamic_;
      break;
    }
    case kCategoricalDistribution: {
      delete layer_.categoricaldistribution_;
      break;
    }
    case kReduceL1: {
      delete layer_.reducel1_;
      break;
    }
    case kReduceL2: {
      delete layer_.reducel2_;
      break;
    }
    case kReduceMax: {
      delete layer_.reducemax_;
      break;
    }
    case kReduceMin: {
      delete layer_.reducemin_;
      break;
    }
    case kReduceSum: {
      delete layer_.reducesum_;
      break;
    }
    case kReduceProd: {
      delete layer_.reduceprod_;
      break;
    }
    case kReduceMean: {
      delete layer_.reducemean_;
      break;
    }
    case kReduceLogSum: {
      delete layer_.reducelogsum_;
      break;
    }
    case kReduceSumSquare: {
      delete layer_.reducesumsquare_;
      break;
    }
    case kReduceLogSumExp: {
      delete layer_.reducelogsumexp_;
      break;
    }
    case kWhereNonZero: {
      delete layer_.wherenonzero_;
      break;
    }
    case kMatrixBandPart: {
      delete layer_.matrixbandpart_;
      break;
    }
    case kLowerTriangular: {
      delete layer_.lowertriangular_;
      break;
    }
    case kUpperTriangular: {
      delete layer_.uppertriangular_;
      break;
    }
    case kWhereBroadcastable: {
      delete layer_.wherebroadcastable_;
      break;
    }
    case kLayerNormalization: {
      delete layer_.layernormalization_;
      break;
    }
    case kNonMaximumSuppression: {
      delete layer_.nonmaximumsuppression_;
      break;
    }
    case kOneHot: {
      delete layer_.onehot_;
      break;
    }
    case kCumSum: {
      delete layer_.cumsum_;
      break;
    }
    case kClampedReLU: {
      delete layer_.clampedrelu_;
      break;
    }
    case kArgSort: {
      delete layer_.argsort_;
      break;
    }
    case kPooling3D: {
      delete layer_.pooling3d_;
      break;
    }
    case kGlobalPooling3D: {
      delete layer_.globalpooling3d_;
      break;
    }
    case kSliceBySize: {
      delete layer_.slicebysize_;
      break;
    }
    case kConvolution3D: {
      delete layer_.convolution3d_;
      break;
    }
    case LAYER_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = LAYER_NOT_SET;
}